

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetLinkerTypeProperty
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  cmValue cVar4;
  ulong uVar5;
  pointer pbVar6;
  long lVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  iterator iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string propName;
  static_string_view DL_END;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  pointer local_138;
  cmList list;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  string local_f0;
  string local_d0;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  propName._M_dataplus._M_p = (pointer)&propName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&propName,"LINKER_TYPE","");
  cVar4 = GetProperty(this,&propName);
  if ((cVar4.Value == (string *)0x0) || ((cVar4.Value)->_M_string_length == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_0057369b;
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,propName._M_dataplus._M_p,
             propName._M_dataplus._M_p + propName._M_string_length);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_d0,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = ((cVar4.Value)->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + (cVar4.Value)->_M_string_length);
  cmGeneratorExpression::Evaluate
            (&local_118,&local_f0,this->LocalGenerator,config,this,&dagChecker,this,lang);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (this->DeviceLink == true) {
    DL_END.super_string_view._M_len = (size_t)&local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&DL_END,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)&DL_END;
    cmList::cmList(&list,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)DL_END.super_string_view._M_len != &local_148) {
      operator_delete((void *)DL_END.super_string_view._M_len,local_148._M_allocated_capacity + 1);
    }
    pbVar2 = list.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    DL_END.super_string_view._M_len = 0xe;
    DL_END.super_string_view._M_str = "</DEVICE_LINK>";
    uVar8 = (long)list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_138 = list.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = uVar8;
    this_00 = list.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar9._M_current = pbVar2;
    if (0 < (long)uVar8 >> 7) {
      local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((list.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                 (uVar8 & 0xffffffffffffff80));
      lVar7 = ((long)uVar8 >> 7) + 1;
      pbVar6 = list.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)0xd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )0x8d468e);
        this_00 = pbVar6;
        if (bVar3) goto LAB_0057359f;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)0xd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )0x8d468e);
        this_00 = pbVar6 + 1;
        if (bVar3) goto LAB_0057359f;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)0xd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )0x8d468e);
        this_00 = pbVar6 + 2;
        if (bVar3) goto LAB_0057359f;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)0xd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )0x8d468e);
        this_00 = pbVar6 + 3;
        if (bVar3) goto LAB_0057359f;
        pbVar6 = pbVar6 + 4;
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
      uVar5 = (long)pbVar2 - (long)local_f8;
      this_00 = local_f8;
    }
    lVar7 = (long)uVar5 >> 5;
    if (lVar7 == 1) {
LAB_00573580:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                            *)0xd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   )0x8d468e);
      if (!bVar3) {
        this_00 = pbVar2;
      }
LAB_0057359f:
      pbVar6 = local_138;
      if ((this_00 != pbVar2) &&
         (pbVar10 = this_00 + 1, iVar9._M_current = this_00, pbVar10 != pbVar2)) {
        do {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                  ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                *)0xd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       )0x8d468e);
          if (!bVar3) {
            std::__cxx11::string::operator=((string *)this_00,(string *)pbVar10);
            this_00 = this_00 + 1;
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar2);
        uVar8 = (long)list.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)list.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = list.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar9._M_current = this_00;
      }
    }
    else {
      if (lVar7 == 2) {
LAB_005734ed:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)0xd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )0x8d468e);
        if (!bVar3) {
          this_00 = this_00 + 1;
          goto LAB_00573580;
        }
        goto LAB_0057359f;
      }
      pbVar6 = local_138;
      if (lVar7 == 3) {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)0xd,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )0x8d468e);
        if (!bVar3) {
          this_00 = this_00 + 1;
          goto LAB_005734ed;
        }
        goto LAB_0057359f;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&list.Values,iVar9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pbVar6->_M_dataplus)._M_p + uVar8));
    cmList::to_string_abi_cxx11_(__return_storage_ptr__,&list);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list.Values);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_118.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_118.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_118._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_118.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_118._M_string_length;
  }
  if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
LAB_0057369b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)propName._M_dataplus._M_p != &propName.field_2) {
    operator_delete(propName._M_dataplus._M_p,propName.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerTypeProperty(
  std::string const& lang, std::string const& config) const
{
  std::string propName{ "LINKER_TYPE" };
  auto linkerType = this->GetProperty(propName);
  if (!linkerType.IsEmpty()) {
    cmGeneratorExpressionDAGChecker dagChecker(this, propName, nullptr,
                                               nullptr);
    auto ltype =
      cmGeneratorExpression::Evaluate(*linkerType, this->GetLocalGenerator(),
                                      config, this, &dagChecker, this, lang);
    if (this->IsDeviceLink()) {
      cmList list{ ltype };
      const auto DL_BEGIN = "<DEVICE_LINK>"_s;
      const auto DL_END = "</DEVICE_LINK>"_s;
      cm::erase_if(list, [&](const std::string& item) {
        return item == DL_BEGIN || item == DL_END;
      });
      return list.to_string();
    }
    return ltype;
  }
  return std::string{};
}